

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O1

void __thiscall xmrig::Api::Api(Api *this,Base *base)

{
  long lVar1;
  Config *pCVar2;
  
  (this->super_IBaseListener)._vptr_IBaseListener = (_func_int **)&PTR__Api_001af5f0;
  this->m_base = base;
  memset(this->m_id,0,0xa0);
  lVar1 = std::chrono::_V2::system_clock::now();
  this->m_timestamp = lVar1 / 1000000;
  this->m_httpd = (Httpd *)0x0;
  (this->m_listeners).
  super__Vector_base<xmrig::IApiListener_*,_std::allocator<xmrig::IApiListener_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_listeners).
  super__Vector_base<xmrig::IApiListener_*,_std::allocator<xmrig::IApiListener_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_listeners).
  super__Vector_base<xmrig::IApiListener_*,_std::allocator<xmrig::IApiListener_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Base::addListener(base,&this->super_IBaseListener);
  pCVar2 = Base::config(base);
  genId(this,&(pCVar2->super_BaseConfig).m_apiId);
  return;
}

Assistant:

xmrig::Api::Api(Base *base) :
    m_base(base),
    m_id(),
    m_workerId(),
    m_timestamp(Chrono::currentMSecsSinceEpoch()),
    m_httpd(nullptr)
{
    base->addListener(this);

    genId(base->config()->apiId());
}